

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O1

int htmlSkipBlankChars(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  xmlParserInputPtr pxVar2;
  uint uVar3;
  xmlChar *pxVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  pxVar2 = ctxt->input;
  pxVar4 = pxVar2->cur;
  iVar6 = pxVar2->line;
  iVar7 = pxVar2->col;
  uVar8 = 0;
  if (ctxt->disableSAX < 2) {
    lVar5 = (long)pxVar2->end - (long)pxVar4;
    do {
      if (lVar5 == 0) {
        pxVar2 = ctxt->input;
        pxVar2->cur = pxVar4;
        if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar4 < 0xfa)) {
          xmlParserGrow(ctxt);
        }
        pxVar4 = ctxt->input->cur;
        lVar5 = (long)ctxt->input->end - (long)pxVar4;
        if (lVar5 == 0) break;
      }
      xVar1 = *pxVar4;
      if (xVar1 == ' ') {
LAB_00168c65:
        iVar7 = iVar7 + 1;
      }
      else {
        if (xVar1 != '\n') {
          if ((xVar1 != '\v') && (0xfa < (byte)(xVar1 - 0xe))) goto LAB_00168c65;
          break;
        }
        iVar6 = iVar6 + 1;
        iVar7 = 1;
      }
      pxVar4 = pxVar4 + 1;
      lVar5 = lVar5 + -1;
      uVar3 = uVar8 + 1;
      if (uVar8 == 0x7fffffff) {
        uVar3 = uVar8;
      }
      uVar8 = uVar3;
    } while (ctxt->disableSAX < 2);
    uVar8 = (uint)(8 < (int)uVar8);
  }
  pxVar2 = ctxt->input;
  pxVar2->cur = pxVar4;
  pxVar2->line = iVar6;
  pxVar2->col = iVar7;
  if ((((char)uVar8 != '\0') && ((pxVar2->flags & 0x40) == 0)) &&
     ((long)pxVar2->end - (long)pxVar4 < 0xfa)) {
    iVar6 = xmlParserGrow(ctxt);
    return iVar6;
  }
  return (int)pxVar4;
}

Assistant:

static int
htmlSkipBlankChars(xmlParserCtxtPtr ctxt) {
    const xmlChar *cur = ctxt->input->cur;
    size_t avail = ctxt->input->end - cur;
    int res = 0;
    int line = ctxt->input->line;
    int col = ctxt->input->col;

    while (!PARSER_STOPPED(ctxt)) {
        if (avail == 0) {
            ctxt->input->cur = cur;
            GROW;
            cur = ctxt->input->cur;
            avail = ctxt->input->end - cur;

            if (avail == 0)
                break;
        }

        if (*cur == '\n') {
            line++;
            col = 1;
        } else if (IS_WS_HTML(*cur)) {
            col++;
        } else {
            break;
        }

        cur += 1;
        avail -= 1;

	if (res < INT_MAX)
	    res++;
    }

    ctxt->input->cur = cur;
    ctxt->input->line = line;
    ctxt->input->col = col;

    if (res > 8)
        GROW;

    return(res);
}